

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udatamem.cpp
# Opt level: O2

void udata_close_63(UDataMemory *pData)

{
  if (pData != (UDataMemory *)0x0) {
    uprv_unmapFile_63(pData);
    if (pData->heapAllocated != '\0') {
      uprv_free_63(pData);
      return;
    }
    pData->mapAddr = (void *)0x0;
    pData->map = (void *)0x0;
    pData->toc = (void *)0x0;
    *(undefined8 *)&pData->heapAllocated = 0;
    *(undefined8 *)&pData->length = 0;
    pData->vFuncs = (commonDataFuncs *)0x0;
    pData->pHeader = (DataHeader *)0x0;
    pData->length = -1;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_close(UDataMemory *pData) {
    if(pData!=NULL) {
        uprv_unmapFile(pData);
        if(pData->heapAllocated ) {
            uprv_free(pData);
        } else {
            UDataMemory_init(pData);
        }
    }
}